

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O2

int fits_clear_Fptr(FITSfile *Fptr,int *status)

{
  long lVar1;
  FITSfile **ppFVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (lVar3 == 10000) goto LAB_001127e7;
    lVar1 = lVar3 + 1;
    ppFVar2 = FptrTable + lVar3;
    lVar3 = lVar1;
  } while (*ppFVar2 != Fptr);
  *(undefined8 *)(lVar1 * 8 + 0x1fccb8) = 0;
LAB_001127e7:
  return *status;
}

Assistant:

int fits_clear_Fptr(FITSfile *Fptr,  /* O - FITS file pointer               */ 
           int *status)              /* IO - error status                   */
/*
   clear the Fptr address from the Fptr Table  
*/
{
    int ii;

    FFLOCK;
    for (ii = 0; ii < NMAXFILES; ii++) {
        if (FptrTable[ii] == Fptr) {
            FptrTable[ii] = 0;
            break;
        }
    }
    FFUNLOCK;
    return(*status);
}